

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void player_kill_monster(monster *mon,player *p,char *note)

{
  monster_base *pmVar1;
  uint16_t uVar2;
  player *p_00;
  _Bool _Var3;
  wchar_t wVar4;
  int iVar5;
  uint32_t uVar6;
  monster_base *pmVar7;
  size_t sVar8;
  int16_t local_54c;
  char local_538 [8];
  char path [1024];
  char unique_name [80];
  uint local_e0;
  wchar_t gain;
  wchar_t soundfx;
  wchar_t desc_mode;
  char buf [80];
  char m_name [80];
  monster_lore *lore;
  int32_t local_28;
  int32_t new_exp_frac;
  int32_t new_exp;
  int32_t div;
  char *note_local;
  player *p_local;
  monster *mon_local;
  
  m_name._72_8_ = get_lore(mon->race);
  wVar4 = L'\0';
  if (note != (char *)0x0) {
    wVar4 = L'Ȁ';
  }
  local_e0 = 6;
  monster_desc(buf + 0x48,0x50,mon,wVar4);
  if (mon->original_race != (monster_race *)0x0) {
    monster_revert_shape(mon);
    m_name._72_8_ = get_lore(mon->race);
    monster_desc(buf + 0x48,0x50,mon,wVar4);
  }
  _Var3 = monster_is_unique(mon);
  if (_Var3) {
    pmVar1 = mon->race->base;
    pmVar7 = lookup_monster_base("Morgoth");
    if (pmVar1 == pmVar7) {
      local_e0 = 0x98;
    }
    else {
      local_e0 = 0x97;
    }
  }
  _Var3 = flag_has_dbg((player->state).pflags,10,0x45,"player->state.pflags","(PF_SOUL_SIPHON)");
  if ((((_Var3) && (player->csp < player->msp)) && (_Var3 = monster_is_living(mon), _Var3)) &&
     ((_Var3 = monster_is_stupid(mon), !_Var3 &&
      (_Var3 = flag_has_dbg(mon->race->flags,0xc,0x46,"mon->race->flags","RF_DEMON"), !_Var3)))) {
    iVar5 = (int)mon->maxhp / 0x1e + 2;
    msg("You gain mana.");
    if ((int)player->lev < (player->csp + iVar5) - (int)player->msp) {
      msg("You absorb too much mana!");
      p_00 = player;
      wVar4 = damroll(2,8);
      take_hit(p_00,wVar4,"mana burn");
    }
    if ((int)player->msp < player->csp + iVar5) {
      local_54c = player->msp;
    }
    else {
      local_54c = player->csp + (short)iVar5;
    }
    player->csp = local_54c;
    player->upkeep->redraw = player->upkeep->redraw | 0x80;
  }
  if (note == (char *)0x0) {
    notice_stuff(p);
    _Var3 = monster_is_visible(mon);
    if (_Var3) {
      _Var3 = monster_is_destroyed(mon);
      if (_Var3) {
        msgt(local_e0,"You have destroyed %s.",buf + 0x48);
      }
      else {
        msgt(local_e0,"You have slain %s.",buf + 0x48);
      }
    }
    else {
      msgt(local_e0,"You have killed %s.",buf + 0x48);
    }
  }
  else {
    sVar8 = strlen(note);
    if (1 < sVar8) {
      notice_stuff(p);
      my_strcap(buf + 0x48);
      msgt(local_e0,"%s%s",buf + 0x48,note);
    }
  }
  iVar5 = (int)p->lev;
  local_28 = (int32_t)(((long)mon->race->mexp * (long)mon->race->level) / (long)iVar5);
  iVar5 = (int)((((long)mon->race->mexp * (long)mon->race->level) % (long)iVar5 << 0x10) /
               (long)iVar5) + (uint)p->exp_frac;
  uVar2 = (uint16_t)iVar5;
  if (iVar5 < 0x10000) {
    p->exp_frac = uVar2;
  }
  else {
    local_28 = local_28 + 1;
    p->exp_frac = uVar2;
  }
  _Var3 = monster_is_unique(mon);
  if (_Var3) {
    if (mon->original_race != (monster_race *)0x0) {
      __assert_fail("mon->original_race == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                    ,0x478,
                    "void player_kill_monster(struct monster *, struct player *, const char *)");
    }
    mon->race->max_num = '\0';
    monster_desc(path + 0x3f8,0x50,mon,L'\x88');
    strnfmt((char *)&soundfx,0x50,"Killed %s",path + 0x3f8);
    history_add(p,(char *)&soundfx,L'\x06');
  }
  _Var3 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
  if ((_Var3) && (uVar6 = Rand_div(3), uVar6 != 0)) {
    strnfmt(local_538,0x400,"%s/bone.%03d",ANGBAND_DIR_BONE);
    _Var3 = file_exists(local_538);
    if (_Var3) {
      file_delete(local_538);
    }
  }
  player_exp_gain(p,local_28);
  monster_death(mon,p,false);
  if (p->timed[0x31] != 0) {
    player_inc_timed(p,L'1',L'\n',false,false,true);
    player_over_exert(p,L'\x10',L'\x05',L'\x03');
    player_over_exert(p,L' ',L'\x05',L'\n');
  }
  _Var3 = monster_is_visible(mon);
  if ((_Var3) || (_Var3 = monster_is_unique(mon), _Var3)) {
    if (*(ushort *)(m_name._72_8_ + 8) < 0x7fff) {
      *(short *)(m_name._72_8_ + 8) = *(short *)(m_name._72_8_ + 8) + 1;
    }
    if (*(ushort *)(m_name._72_8_ + 0xc) < 0x7fff) {
      *(short *)(m_name._72_8_ + 0xc) = *(short *)(m_name._72_8_ + 0xc) + 1;
    }
    lore_update(mon->race,(monster_lore_conflict *)m_name._72_8_);
    monster_race_track(p->upkeep,mon->race);
  }
  delete_monster_idx((chunk *)cave,mon->midx);
  return;
}

Assistant:

static void player_kill_monster(struct monster *mon, struct player *p,
		const char *note)
{
	int32_t div, new_exp, new_exp_frac;
	struct monster_lore *lore = get_lore(mon->race);
	char m_name[80];
	char buf[80];
	int desc_mode = MDESC_DEFAULT | ((note) ? MDESC_COMMA : 0);

	/* Assume normal death sound */
	int soundfx = MSG_KILL;

	/* Extract monster name */
	monster_desc(m_name, sizeof(m_name), mon, desc_mode);

	/* Shapechanged monsters revert on death */
	if (mon->original_race) {
		monster_revert_shape(mon);
		lore = get_lore(mon->race);
		monster_desc(m_name, sizeof(m_name), mon, desc_mode);
	}

	/* Play a special sound if the monster was unique */
	if (monster_is_unique(mon)) {
		if (mon->race->base == lookup_monster_base("Morgoth"))
			soundfx = MSG_KILL_KING;
		else
			soundfx = MSG_KILL_UNIQUE;
	}

	/* Specialty ability Soul Siphon */
	if (player_has(player, PF_SOUL_SIPHON) && (player->csp < player->msp) &&
		monster_is_living(mon) && !monster_is_stupid(mon) &&
		!rf_has(mon->race->flags, RF_DEMON)) {
		int gain = 2 + (mon->maxhp / 30);
		msg("You gain mana.");

		/* If there is a lot of excess mana, it can do damage */
		if (player->csp + gain - player->msp > player->lev) {
			msg("You absorb too much mana!");
			take_hit(player, damroll(2, 8), "mana burn");
		}
		player->csp = MIN(player->csp + gain, player->msp);
		player->upkeep->redraw |= PR_MANA;
	}

	/* Death message */
	if (note) {
		if (strlen(note) <= 1) {
			/* Death by Spell attack - messages handled by project_m() */
		} else {
			/* Make sure to flush any monster messages first */
			notice_stuff(p);

			/* Death by Missile attack */
			my_strcap(m_name);
			msgt(soundfx, "%s%s", m_name, note);
		}
	} else {
		/* Make sure to flush any monster messages first */
		notice_stuff(p);

		if (!monster_is_visible(mon))
			/* Death by physical attack -- invisible monster */
			msgt(soundfx, "You have killed %s.", m_name);
		else if (monster_is_destroyed(mon))
			/* Death by Physical attack -- non-living monster */
			msgt(soundfx, "You have destroyed %s.", m_name);
		else
			/* Death by Physical attack -- living monster */
			msgt(soundfx, "You have slain %s.", m_name);
	}

	/* Player level */
	div = p->lev;

	/* Give some experience for the kill */
	new_exp = ((long)mon->race->mexp * mon->race->level) / div;

	/* Handle fractional experience */
	new_exp_frac = ((((long)mon->race->mexp * mon->race->level) % div)
					* 0x10000L / div) + p->exp_frac;

	/* Keep track of experience */
	if (new_exp_frac >= 0x10000L) {
		new_exp++;
		p->exp_frac = (uint16_t)(new_exp_frac - 0x10000L);
	} else {
		p->exp_frac = (uint16_t)new_exp_frac;
	}

	/* When the player kills a Unique, it stays dead */
	if (monster_is_unique(mon)) {
		char unique_name[80];
		assert(mon->original_race == NULL);
		mon->race->max_num = 0;

		/* This gets the correct name if we slay an invisible
		 * unique and don't have See Invisible. */
		monster_desc(unique_name, sizeof(unique_name), mon,
					 MDESC_DIED_FROM);

		/* Log the slaying of a unique */
		strnfmt(buf, sizeof(buf), "Killed %s", unique_name);
		history_add(p, buf, HIST_SLAY_UNIQUE);
	}

	/* When the player kills a player ghost, the bones file that it used
	 * is (often) deleted. */
	if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		if (!one_in_(3)) {
			char path[1024];
			strnfmt(path, sizeof(path), "%s/bone.%03d", ANGBAND_DIR_BONE,
					cave->ghost->bones_selector);
			if (file_exists(path)) file_delete(path);
		}
	}

	/* Gain experience */
	player_exp_gain(p, new_exp);

	/* Generate treasure */
	monster_death(mon, p, false);

	/* Bloodlust bonus */
	if (p->timed[TMD_BLOODLUST]) {
		player_inc_timed(p, TMD_BLOODLUST, 10, false, false, true);
		player_over_exert(p, PY_EXERT_CONF, 5, 3);
		player_over_exert(p, PY_EXERT_HALLU, 5, 10);
	}

	/* Recall even invisible uniques or winners */
	if (monster_is_visible(mon) || monster_is_unique(mon)) {
		/* Count kills this life */
		if (lore->pkills < SHRT_MAX) lore->pkills++;

		/* Count kills in all lives */
		if (lore->tkills < SHRT_MAX) lore->tkills++;

		/* Update lore and tracking */
		lore_update(mon->race, lore);
		monster_race_track(p->upkeep, mon->race);
	}

	/* Delete the monster */
	delete_monster_idx(cave, mon->midx);
}